

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::inline_instance(Generator *top)

{
  undefined1 local_58 [8];
  InlineGeneratorVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  InlineGeneratorVisitor::InlineGeneratorVisitor((InlineGeneratorVisitor *)local_58);
  IRVisitor::visit_generator_root_tp
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  InlineGeneratorVisitor::~InlineGeneratorVisitor((InlineGeneratorVisitor *)local_58);
  return;
}

Assistant:

void inline_instance(Generator* top) {
    // this has to be run after decouple generator ports
    InlineGeneratorVisitor visitor;
    // we only allow leaf instances to be inlined, users can run this pass multiple times
    // by making this assumption, we can run the pass in parallel since the parent of the target
    // won't run this pass hence avoiding race conditions
    visitor.visit_generator_root_tp(top);
}